

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__encode_png_line
               (uchar *pixels,int stride_bytes,int width,int height,int y,int n,int filter_type,
               char *line_buffer)

{
  char cVar1;
  int iVar2;
  uchar uVar3;
  void *__src;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  void *in_stack_00000010;
  int signed_stride;
  uchar *z;
  int type;
  int i;
  int *mymap;
  int local_60;
  int local_5c;
  int *local_48;
  int local_2c;
  
  if (in_R8D == 0) {
    local_48 = stbiw__encode_png_line::firstmap;
  }
  else {
    local_48 = stbiw__encode_png_line::mapping;
  }
  iVar2 = local_48[in_stack_00000008];
  local_5c = in_R8D;
  if (stbi__flip_vertically_on_write != 0) {
    local_5c = (in_ECX + -1) - in_R8D;
  }
  __src = (void *)(in_RDI + in_ESI * local_5c);
  local_60 = in_ESI;
  if (stbi__flip_vertically_on_write != 0) {
    local_60 = -in_ESI;
  }
  if (iVar2 == 0) {
    memcpy(in_stack_00000010,__src,(long)(in_EDX * in_R9D));
  }
  else {
    for (local_2c = 0; local_2c < in_R9D; local_2c = local_2c + 1) {
      switch(iVar2) {
      case 1:
        *(undefined1 *)((long)in_stack_00000010 + (long)local_2c) =
             *(undefined1 *)((long)__src + (long)local_2c);
        break;
      case 2:
        *(char *)((long)in_stack_00000010 + (long)local_2c) =
             *(char *)((long)__src + (long)local_2c) -
             *(char *)((long)__src + (long)(local_2c - local_60));
        break;
      case 3:
        *(char *)((long)in_stack_00000010 + (long)local_2c) =
             *(char *)((long)__src + (long)local_2c) -
             (char)((int)(uint)*(byte *)((long)__src + (long)(local_2c - local_60)) >> 1);
        break;
      case 4:
        cVar1 = *(char *)((long)__src + (long)local_2c);
        uVar3 = stbiw__paeth(0,(uint)*(byte *)((long)__src + (long)(local_2c - local_60)),0);
        *(uchar *)((long)in_stack_00000010 + (long)local_2c) = cVar1 - uVar3;
        break;
      case 5:
        *(undefined1 *)((long)in_stack_00000010 + (long)local_2c) =
             *(undefined1 *)((long)__src + (long)local_2c);
        break;
      case 6:
        *(undefined1 *)((long)in_stack_00000010 + (long)local_2c) =
             *(undefined1 *)((long)__src + (long)local_2c);
      }
    }
    local_2c = in_R9D;
    switch(iVar2) {
    case 1:
      for (; local_2c < in_EDX * in_R9D; local_2c = local_2c + 1) {
        *(char *)((long)in_stack_00000010 + (long)local_2c) =
             *(char *)((long)__src + (long)local_2c) -
             *(char *)((long)__src + (long)(local_2c - in_R9D));
      }
      break;
    case 2:
      for (; local_2c < in_EDX * in_R9D; local_2c = local_2c + 1) {
        *(char *)((long)in_stack_00000010 + (long)local_2c) =
             *(char *)((long)__src + (long)local_2c) -
             *(char *)((long)__src + (long)(local_2c - local_60));
      }
      break;
    case 3:
      for (; local_2c < in_EDX * in_R9D; local_2c = local_2c + 1) {
        *(char *)((long)in_stack_00000010 + (long)local_2c) =
             *(char *)((long)__src + (long)local_2c) -
             (char)((int)((uint)*(byte *)((long)__src + (long)(local_2c - in_R9D)) +
                         (uint)*(byte *)((long)__src + (long)(local_2c - local_60))) >> 1);
      }
      break;
    case 4:
      for (; local_2c < in_EDX * in_R9D; local_2c = local_2c + 1) {
        cVar1 = *(char *)((long)__src + (long)local_2c);
        uVar3 = stbiw__paeth((uint)*(byte *)((long)__src + (long)(local_2c - in_R9D)),
                             (uint)*(byte *)((long)__src + (long)(local_2c - local_60)),
                             (uint)*(byte *)((long)__src + (long)((local_2c - local_60) - in_R9D)));
        *(uchar *)((long)in_stack_00000010 + (long)local_2c) = cVar1 - uVar3;
      }
      break;
    case 5:
      for (; local_2c < in_EDX * in_R9D; local_2c = local_2c + 1) {
        *(char *)((long)in_stack_00000010 + (long)local_2c) =
             *(char *)((long)__src + (long)local_2c) -
             (char)((int)(uint)*(byte *)((long)__src + (long)(local_2c - in_R9D)) >> 1);
      }
      break;
    case 6:
      for (; local_2c < in_EDX * in_R9D; local_2c = local_2c + 1) {
        cVar1 = *(char *)((long)__src + (long)local_2c);
        uVar3 = stbiw__paeth((uint)*(byte *)((long)__src + (long)(local_2c - in_R9D)),0,0);
        *(uchar *)((long)in_stack_00000010 + (long)local_2c) = cVar1 - uVar3;
      }
    }
  }
  return;
}

Assistant:

static void stbiw__encode_png_line(unsigned char *pixels, int stride_bytes, int width, int height, int y, int n, int filter_type, signed char *line_buffer)
{
   static int mapping[] = { 0,1,2,3,4 };
   static int firstmap[] = { 0,1,0,5,6 };
   int *mymap = (y != 0) ? mapping : firstmap;
   int i;
   int type = mymap[filter_type];
   unsigned char *z = pixels + stride_bytes * (stbi__flip_vertically_on_write ? height-1-y : y);
   int signed_stride = stbi__flip_vertically_on_write ? -stride_bytes : stride_bytes;

   if (type==0) {
      memcpy(line_buffer, z, width*n);
      return;
   }

   // first loop isn't optimized since it's just one pixel
   for (i = 0; i < n; ++i) {
      switch (type) {
         case 1: line_buffer[i] = z[i]; break;
         case 2: line_buffer[i] = z[i] - z[i-signed_stride]; break;
         case 3: line_buffer[i] = z[i] - (z[i-signed_stride]>>1); break;
         case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-signed_stride],0)); break;
         case 5: line_buffer[i] = z[i]; break;
         case 6: line_buffer[i] = z[i]; break;
      }
   }
   switch (type) {
      case 1: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - z[i-n]; break;
      case 2: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - z[i-signed_stride]; break;
      case 3: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - ((z[i-n] + z[i-signed_stride])>>1); break;
      case 4: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-signed_stride], z[i-signed_stride-n]); break;
      case 5: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - (z[i-n]>>1); break;
      case 6: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
   }
}